

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O0

CURLcode file_do(connectdata *conn,_Bool *done)

{
  SessionHandle *data_00;
  long lVar1;
  __dev_t _Var2;
  _Bool _Var3;
  int iVar4;
  int iVar5;
  char *ptr;
  __off64_t _Var6;
  size_t len;
  bool bVar7;
  timeval now_00;
  size_t local_180;
  int local_16c;
  size_t bytestoread;
  tm *tm;
  tm buffer;
  time_t filetime;
  FILEPROTO *file;
  timeval now;
  long lStack_f0;
  int fd;
  curl_off_t bytecount;
  char *buf;
  SessionHandle *data;
  ssize_t nread;
  __dev_t _Stack_c8;
  _Bool fstated;
  curl_off_t expected_size;
  stat statbuf;
  CURLcode result;
  _Bool *done_local;
  connectdata *conn_local;
  
  statbuf.__glibc_reserved[2]._4_4_ = CURLE_OK;
  _Stack_c8 = 0;
  data_00 = conn->data;
  ptr = (data_00->state).buffer;
  lStack_f0 = 0;
  now_00 = curlx_tvnow();
  *done = true;
  Curl_initinfo(data_00);
  Curl_pgrsStartNow(data_00);
  if (((data_00->set).upload & 1U) == 0) {
    iVar5 = *(int *)((long)(conn->data->req).protop + 0x10);
    iVar4 = fstat64(iVar5,(stat64 *)&expected_size);
    _Var2 = statbuf.st_rdev;
    bVar7 = iVar4 != -1;
    if ((((!bVar7) ||
         ((data_00->info).filetime = statbuf.st_atim.tv_nsec, _Stack_c8 = _Var2,
         (data_00->state).range != (char *)0x0)) ||
        ((data_00->set).timecondition == CURL_TIMECOND_NONE)) ||
       (_Var3 = Curl_meets_timecondition(data_00,(data_00->info).filetime), _Var3)) {
      if (((((data_00->set).opt_no_body & 1U) == 0) || (((data_00->set).include_header & 1U) == 0))
         || (!bVar7)) {
        file_range(conn);
        if ((data_00->state).resume_from < 0) {
          if (!bVar7) {
            Curl_failf(data_00,"Can\'t get the size of file.");
            return CURLE_READ_ERROR;
          }
          (data_00->state).resume_from = statbuf.st_rdev + (data_00->state).resume_from;
        }
        if ((long)_Stack_c8 < (data_00->state).resume_from) {
          Curl_failf(data_00,"failed to resume file:// transfer");
          conn_local._4_4_ = CURLE_BAD_DOWNLOAD_RESUME;
        }
        else {
          _Stack_c8 = _Stack_c8 - (data_00->state).resume_from;
          if (0 < (data_00->req).maxdownload) {
            _Stack_c8 = (data_00->req).maxdownload;
          }
          if ((bVar7) && (_Stack_c8 == 0)) {
            conn_local._4_4_ = CURLE_OK;
          }
          else {
            if (bVar7) {
              Curl_pgrsSetDownloadSize(data_00,_Stack_c8);
            }
            if (((data_00->state).resume_from == 0) ||
               (lVar1 = (data_00->state).resume_from,
               _Var6 = lseek64(iVar5,(data_00->state).resume_from,0), lVar1 == _Var6)) {
              Curl_pgrsTime(data_00,TIMER_STARTTRANSFER);
              while (statbuf.__glibc_reserved[2]._4_4_ == CURLE_OK) {
                if ((long)_Stack_c8 < 0x3fff) {
                  local_180 = curlx_sotouz(_Stack_c8);
                }
                else {
                  local_180 = 0x3fff;
                }
                len = read(iVar5,ptr,local_180);
                if (((long)len < 1) || (ptr[len] = '\0', _Stack_c8 == 0)) break;
                lStack_f0 = len + lStack_f0;
                _Stack_c8 = _Stack_c8 - len;
                statbuf.__glibc_reserved[2]._4_4_ = Curl_client_write(conn,1,ptr,len);
                if (statbuf.__glibc_reserved[2]._4_4_ != CURLE_OK) {
                  return statbuf.__glibc_reserved[2]._4_4_;
                }
                Curl_pgrsSetDownloadCounter(data_00,lStack_f0);
                iVar4 = Curl_pgrsUpdate(conn);
                if (iVar4 == 0) {
                  statbuf.__glibc_reserved[2]._4_4_ = Curl_speedcheck(data_00,now_00);
                }
                else {
                  statbuf.__glibc_reserved[2]._4_4_ = CURLE_ABORTED_BY_CALLBACK;
                }
              }
              iVar5 = Curl_pgrsUpdate(conn);
              if (iVar5 != 0) {
                statbuf.__glibc_reserved[2]._4_4_ = CURLE_ABORTED_BY_CALLBACK;
              }
              conn_local._4_4_ = statbuf.__glibc_reserved[2]._4_4_;
            }
            else {
              conn_local._4_4_ = CURLE_BAD_DOWNLOAD_RESUME;
            }
          }
        }
      }
      else {
        curl_msnprintf(ptr,0x4001,"Content-Length: %ld\r\n",_Stack_c8);
        statbuf.__glibc_reserved[2]._4_4_ = Curl_client_write(conn,3,ptr,0);
        conn_local._4_4_ = statbuf.__glibc_reserved[2]._4_4_;
        if ((statbuf.__glibc_reserved[2]._4_4_ == CURLE_OK) &&
           (statbuf.__glibc_reserved[2]._4_4_ =
                 Curl_client_write(conn,3,"Accept-ranges: bytes\r\n",0),
           conn_local._4_4_ = statbuf.__glibc_reserved[2]._4_4_,
           statbuf.__glibc_reserved[2]._4_4_ == CURLE_OK)) {
          if (bVar7) {
            buffer.tm_zone = (char *)statbuf.st_atim.tv_nsec;
            statbuf.__glibc_reserved[2]._4_4_ = Curl_gmtime(statbuf.st_atim.tv_nsec,(tm *)&tm);
            if (statbuf.__glibc_reserved[2]._4_4_ != CURLE_OK) {
              return statbuf.__glibc_reserved[2]._4_4_;
            }
            if (buffer.tm_mon == 0) {
              local_16c = 6;
            }
            else {
              local_16c = buffer.tm_mon + -1;
            }
            curl_msnprintf(ptr,0x3fff,"Last-Modified: %s, %02d %s %4d %02d:%02d:%02d GMT\r\n",
                           Curl_wkday[local_16c],(ulong)(uint)buffer.tm_min,
                           Curl_month[buffer.tm_hour],buffer.tm_mday + 0x76c,buffer.tm_sec,tm._4_4_,
                           tm._0_4_);
            statbuf.__glibc_reserved[2]._4_4_ = Curl_client_write(conn,3,ptr,0);
          }
          if (bVar7) {
            Curl_pgrsSetDownloadSize(data_00,_Stack_c8);
          }
          conn_local._4_4_ = statbuf.__glibc_reserved[2]._4_4_;
        }
      }
    }
    else {
      *done = true;
      conn_local._4_4_ = CURLE_OK;
    }
  }
  else {
    conn_local._4_4_ = file_upload(conn);
  }
  return conn_local._4_4_;
}

Assistant:

static CURLcode file_do(struct connectdata *conn, bool *done)
{
  /* This implementation ignores the host name in conformance with
     RFC 1738. Only local files (reachable via the standard file system)
     are supported. This means that files on remotely mounted directories
     (via NFS, Samba, NT sharing) can be accessed through a file:// URL
  */
  CURLcode result = CURLE_OK;
  struct_stat statbuf; /* struct_stat instead of struct stat just to allow the
                          Windows version to have a different struct without
                          having to redefine the simple word 'stat' */
  curl_off_t expected_size=0;
  bool fstated=FALSE;
  ssize_t nread;
  struct SessionHandle *data = conn->data;
  char *buf = data->state.buffer;
  curl_off_t bytecount = 0;
  int fd;
  struct timeval now = Curl_tvnow();
  struct FILEPROTO *file;

  *done = TRUE; /* unconditionally */

  Curl_initinfo(data);
  Curl_pgrsStartNow(data);

  if(data->set.upload)
    return file_upload(conn);

  file = conn->data->req.protop;

  /* get the fd from the connection phase */
  fd = file->fd;

  /* VMS: This only works reliable for STREAMLF files */
  if(-1 != fstat(fd, &statbuf)) {
    /* we could stat it, then read out the size */
    expected_size = statbuf.st_size;
    /* and store the modification time */
    data->info.filetime = (long)statbuf.st_mtime;
    fstated = TRUE;
  }

  if(fstated && !data->state.range && data->set.timecondition) {
    if(!Curl_meets_timecondition(data, (time_t)data->info.filetime)) {
      *done = TRUE;
      return CURLE_OK;
    }
  }

  /* If we have selected NOBODY and HEADER, it means that we only want file
     information. Which for FILE can't be much more than the file size and
     date. */
  if(data->set.opt_no_body && data->set.include_header && fstated) {
    snprintf(buf, sizeof(data->state.buffer),
             "Content-Length: %" CURL_FORMAT_CURL_OFF_T "\r\n", expected_size);
    result = Curl_client_write(conn, CLIENTWRITE_BOTH, buf, 0);
    if(result)
      return result;

    result = Curl_client_write(conn, CLIENTWRITE_BOTH,
                               (char *)"Accept-ranges: bytes\r\n", 0);
    if(result)
      return result;

    if(fstated) {
      time_t filetime = (time_t)statbuf.st_mtime;
      struct tm buffer;
      const struct tm *tm = &buffer;
      result = Curl_gmtime(filetime, &buffer);
      if(result)
        return result;

      /* format: "Tue, 15 Nov 1994 12:45:26 GMT" */
      snprintf(buf, BUFSIZE-1,
               "Last-Modified: %s, %02d %s %4d %02d:%02d:%02d GMT\r\n",
               Curl_wkday[tm->tm_wday?tm->tm_wday-1:6],
               tm->tm_mday,
               Curl_month[tm->tm_mon],
               tm->tm_year + 1900,
               tm->tm_hour,
               tm->tm_min,
               tm->tm_sec);
      result = Curl_client_write(conn, CLIENTWRITE_BOTH, buf, 0);
    }
    /* if we fstat()ed the file, set the file size to make it available post-
       transfer */
    if(fstated)
      Curl_pgrsSetDownloadSize(data, expected_size);
    return result;
  }

  /* Check whether file range has been specified */
  file_range(conn);

  /* Adjust the start offset in case we want to get the N last bytes
   * of the stream iff the filesize could be determined */
  if(data->state.resume_from < 0) {
    if(!fstated) {
      failf(data, "Can't get the size of file.");
      return CURLE_READ_ERROR;
    }
    else
      data->state.resume_from += (curl_off_t)statbuf.st_size;
  }

  if(data->state.resume_from <= expected_size)
    expected_size -= data->state.resume_from;
  else {
    failf(data, "failed to resume file:// transfer");
    return CURLE_BAD_DOWNLOAD_RESUME;
  }

  /* A high water mark has been specified so we obey... */
  if(data->req.maxdownload > 0)
    expected_size = data->req.maxdownload;

  if(fstated && (expected_size == 0))
    return CURLE_OK;

  /* The following is a shortcut implementation of file reading
     this is both more efficient than the former call to download() and
     it avoids problems with select() and recv() on file descriptors
     in Winsock */
  if(fstated)
    Curl_pgrsSetDownloadSize(data, expected_size);

  if(data->state.resume_from) {
    if(data->state.resume_from !=
       lseek(fd, data->state.resume_from, SEEK_SET))
      return CURLE_BAD_DOWNLOAD_RESUME;
  }

  Curl_pgrsTime(data, TIMER_STARTTRANSFER);

  while(!result) {
    /* Don't fill a whole buffer if we want less than all data */
    size_t bytestoread =
      (expected_size < CURL_OFF_T_C(BUFSIZE) - CURL_OFF_T_C(1)) ?
      curlx_sotouz(expected_size) : BUFSIZE - 1;

    nread = read(fd, buf, bytestoread);

    if(nread > 0)
      buf[nread] = 0;

    if(nread <= 0 || expected_size == 0)
      break;

    bytecount += nread;
    expected_size -= nread;

    result = Curl_client_write(conn, CLIENTWRITE_BODY, buf, nread);
    if(result)
      return result;

    Curl_pgrsSetDownloadCounter(data, bytecount);

    if(Curl_pgrsUpdate(conn))
      result = CURLE_ABORTED_BY_CALLBACK;
    else
      result = Curl_speedcheck(data, now);
  }
  if(Curl_pgrsUpdate(conn))
    result = CURLE_ABORTED_BY_CALLBACK;

  return result;
}